

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basetableref.cpp
# Opt level: O2

string * __thiscall
duckdb::BaseTableRef::ToString_abi_cxx11_(string *__return_storage_ptr__,BaseTableRef *this)

{
  size_type sVar1;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string local_78;
  string local_58;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = (this->catalog_name)._M_string_length;
  if (sVar1 == 0) {
    ::std::__cxx11::string::string
              ((string *)&bStack_98,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_58);
  }
  else {
    KeywordHelper::WriteOptionallyQuoted(&local_58,&this->catalog_name,'\"',true);
    ::std::operator+(&bStack_98,&local_58,".");
  }
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_98);
  if (sVar1 != 0) {
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  sVar1 = (this->schema_name)._M_string_length;
  if (sVar1 == 0) {
    ::std::__cxx11::string::string
              ((string *)&bStack_98,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_78);
  }
  else {
    KeywordHelper::WriteOptionallyQuoted(&local_78,&this->schema_name,'\"',true);
    ::std::operator+(&bStack_98,&local_78,".");
  }
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_98);
  if (sVar1 != 0) {
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  KeywordHelper::WriteOptionallyQuoted(&bStack_98,&this->table_name,'\"',true);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_98);
  TableRef::AliasToString
            (&bStack_98,&this->super_TableRef,&(this->super_TableRef).column_name_alias);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_98);
  if ((this->at_clause).super_unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>.
      _M_t.super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
      super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl != (AtClause *)0x0) {
    this_00 = unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true>::operator->
                        (&this->at_clause);
    AtClause::ToString_abi_cxx11_(&local_38,this_00);
    ::std::operator+(&bStack_98," ",&local_38);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&bStack_98);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  TableRef::SampleToString_abi_cxx11_(&bStack_98,&this->super_TableRef);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&bStack_98);
  return __return_storage_ptr__;
}

Assistant:

string BaseTableRef::ToString() const {
	string result;
	result += catalog_name.empty() ? "" : (KeywordHelper::WriteOptionallyQuoted(catalog_name) + ".");
	result += schema_name.empty() ? "" : (KeywordHelper::WriteOptionallyQuoted(schema_name) + ".");
	result += KeywordHelper::WriteOptionallyQuoted(table_name);
	result += AliasToString(column_name_alias);
	if (at_clause) {
		result += " " + at_clause->ToString();
	}
	result += SampleToString();
	return result;
}